

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O0

void __thiscall TEST_PlayerHandTest_Kon_Test::testBody(TEST_PlayerHandTest_Kon_Test *this)

{
  initializer_list<mahjong::Tile> __l;
  bool bVar1;
  UtestShell *pUVar2;
  PlayerHand *this_00;
  NormalTestTerminator local_68 [3];
  allocator<mahjong::Tile> local_49;
  Tile local_48 [4];
  iterator local_38;
  size_type local_30;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_28;
  TEST_PlayerHandTest_Kon_Test *local_10;
  TEST_PlayerHandTest_Kon_Test *this_local;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h;
  local_10 = this;
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  local_48[0] = OneOfCircles;
  local_48[1] = 0xd2;
  local_48[2] = 0xd2;
  local_48[3] = 0xd2;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<mahjong::Tile>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_28,__l,&local_49);
  mahjong::PlayerHand::bindOpenQuad(this_00,&local_28);
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~vector(&local_28);
  std::allocator<mahjong::Tile>::~allocator(&local_49);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = mahjong::PlayerHand::isClosedHand(&(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h)
  ;
  local_68[0].super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
  NormalTestTerminator::NormalTestTerminator(local_68);
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!h.isClosedHand()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
             ,0x33,local_68);
  NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c470a);
  return;
}

Assistant:

TEST(PlayerHandTest, Kon)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindOpenQuad({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}